

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

void __thiscall QDockWidget::initStyleOption(QDockWidget *this,QStyleOptionDockWidget *option)

{
  long lVar1;
  bool bVar2;
  QDockWidgetPrivate *pQVar3;
  QDockWidgetGroupWindow *pQVar4;
  QDockWidgetLayout *pQVar5;
  QDockWidgetLayout *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QRect QVar6;
  QDockWidgetLayout *l;
  QDockWidgetGroupWindow *floatingTab;
  QDockWidgetLayout *dwlayout;
  QDockWidgetPrivate *d;
  DockWidgetFeature in_stack_ffffffffffffff9c;
  QWidget *widget;
  QStyleOption *in_stack_ffffffffffffffb8;
  _func_int **local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QDockWidget *)0x58cbdf);
  if (in_RSI != (QDockWidgetLayout *)0x0) {
    QWidget::layout((QWidget *)0x58cbfb);
    qobject_cast<QDockWidgetLayout*>((QObject *)0x58cc03);
    QObject::parent((QObject *)0x58cc12);
    pQVar4 = qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x58cc1a);
    pQVar5 = in_RSI;
    widget = in_RDI;
    if ((pQVar4 != (QDockWidgetGroupWindow *)0x0) &&
       (bVar2 = isFloating((QDockWidget *)0x58cc3b), widget = in_RDI, !bVar2)) {
      in_RDI = QWidget::parentWidget((QWidget *)0x58cc49);
    }
    QStyleOption::initFrom(in_stack_ffffffffffffffb8,widget);
    QVar6 = QDockWidgetLayout::titleArea(pQVar5);
    local_18 = QVar6._0_8_;
    (in_RSI->super_QLayout).super_QLayoutItem._vptr_QLayoutItem = local_18;
    local_10 = QVar6._8_8_;
    *(undefined8 *)&(in_RSI->super_QLayout).super_QLayoutItem.align = local_10;
    QString::operator=((QString *)&(in_RSI->_titleArea).x2,(QString *)&pQVar3->fixedWindowTitle);
    bVar2 = hasFeature((QDockWidget *)in_RDI,in_stack_ffffffffffffff9c);
    *(bool *)&in_RSI[1].super_QLayout.super_QLayoutItem._vptr_QLayoutItem = bVar2;
    bVar2 = hasFeature((QDockWidget *)in_RDI,in_stack_ffffffffffffff9c);
    *(bool *)((long)&in_RSI[1].super_QLayout.super_QLayoutItem._vptr_QLayoutItem + 1) = bVar2;
    bVar2 = hasFeature((QDockWidget *)in_RDI,in_stack_ffffffffffffff9c);
    *(bool *)((long)&in_RSI[1].super_QLayout.super_QLayoutItem._vptr_QLayoutItem + 2) = bVar2;
    QWidget::layout((QWidget *)0x58cd0e);
    pQVar5 = qobject_cast<QDockWidgetLayout*>((QObject *)0x58cd16);
    *(byte *)((long)&in_RSI[1].super_QLayout.super_QLayoutItem._vptr_QLayoutItem + 3) =
         (pQVar5->super_QLayout).super_QLayoutItem.field_0xc & 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockWidget::initStyleOption(QStyleOptionDockWidget *option) const
{
    Q_D(const QDockWidget);

    if (!option)
        return;
    QDockWidgetLayout *dwlayout = qobject_cast<QDockWidgetLayout*>(layout());

    QDockWidgetGroupWindow *floatingTab = qobject_cast<QDockWidgetGroupWindow*>(parent());
    // If we are in a floating tab, init from the parent because the attributes and the geometry
    // of the title bar should be taken from the floating window.
    option->initFrom(floatingTab && !isFloating() ? parentWidget() : this);
    option->rect = dwlayout->titleArea();
    option->title = d->fixedWindowTitle;
    option->closable = hasFeature(this, QDockWidget::DockWidgetClosable);
    option->movable = hasFeature(this, QDockWidget::DockWidgetMovable);
    option->floatable = hasFeature(this, QDockWidget::DockWidgetFloatable);

    QDockWidgetLayout *l = qobject_cast<QDockWidgetLayout*>(layout());
    option->verticalTitleBar = l->verticalTitleBar;
}